

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 13.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  int local_2c;
  char cStack_25;
  int i;
  char blue [8];
  bool y;
  int x;
  char **argv_local;
  int argc_local;
  
  blue[1] = '\x01';
  blue[2] = '\0';
  blue[3] = '\0';
  blue[4] = '\0';
  _cStack_25 = 0x6d34333b315b1b;
  unique0x100001a6 = argv;
  std::operator<<((ostream *)&std::cout,&cStack_25);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_689);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  blue._1_4_ = blue._1_4_ + 1;
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------------------------"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6c2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::istream::operator>>((istream *)&std::cin,(bool *)blue);
  if ((blue[0] & 1U) == 1) {
    for (local_2c = 1; local_2c < 0xb; local_2c = local_2c + 1) {
      poVar1 = std::operator<<((ostream *)&std::cout,"YESS...Uma ponte sob o abismo!");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"Tente outra vez.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
  int x = 1;
  bool y;

  char blue[] = {0x1b, '[', '1', ';', '3', '4', 'm', 0};
  cout << blue;

  do
  {
    cout << "O homem é uma ponte, atada entre o animal e o super homem..." << endl;
    x++;
    break;
  } while (x <= 20);

  cout << endl;
  cout << "--------------------------------------------------------------------------" << endl;
  cout << "Foi Nietzsche quem disse isso? digite (1)sim ou (0)não: " << endl;
  cin >> y;

  if (y == 1)
    {
      for (int i = 1; i <= 10; i++)
      {
        cout << "YESS...Uma ponte sob o abismo!" << endl;
      }
    }
    else
    {
      cout << "Tente outra vez." << endl;
    }

  return 0;
}